

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 matchOther)

{
  byte bVar1;
  u8 uVar2;
  bool bVar3;
  u32 uVar4;
  uint uVar5;
  int iVar6;
  byte *zString_00;
  size_t sVar7;
  bool bVar8;
  u32 uVar9;
  u32 uVar10;
  uint uVar11;
  u8 *puVar13;
  byte *pbVar14;
  bool bVar15;
  u8 *zPattern_local;
  byte *local_58;
  uint local_4c;
  compareInfo *local_48;
  uint local_40;
  char local_3b;
  uchar local_3a;
  undefined1 local_39;
  u8 *local_38;
  ulong uVar12;
  
  local_40 = (uint)pInfo->matchOne;
  bVar1 = pInfo->matchAll;
  uVar2 = pInfo->noCase;
  local_38 = (u8 *)0x0;
  zPattern_local = zPattern;
  local_58 = zString;
  local_4c = matchOther;
  local_48 = pInfo;
LAB_00127cae:
  do {
    uVar10 = (u32)(char)*zPattern_local;
    if ((char)*zPattern_local < '\0') {
      uVar10 = sqlite3Utf8Read(&zPattern_local);
    }
    else {
      zPattern_local = zPattern_local + 1;
    }
    uVar5 = local_40;
    if (uVar10 == 0) {
      return (uint)(*local_58 != 0);
    }
    if (uVar10 == bVar1) {
      goto LAB_00127e88;
    }
    if (uVar10 == local_4c) {
      if (local_48->matchSet != '\0') {
        uVar10 = sqlite3Utf8Read(&local_58);
        if (uVar10 == 0) {
          return 1;
        }
        uVar4 = sqlite3Utf8Read(&zPattern_local);
        uVar9 = 0;
        bVar15 = uVar4 == 0x5e;
        if (bVar15) {
          uVar4 = sqlite3Utf8Read(&zPattern_local);
        }
        bVar8 = false;
        if (uVar4 != 0x5d) goto LAB_00127e04;
        bVar8 = uVar10 == 0x5d;
LAB_00127df5:
        uVar9 = 0;
LAB_00127df7:
        uVar4 = sqlite3Utf8Read(&zPattern_local);
LAB_00127e04:
        if (uVar4 == 0x2d) {
          if ((*zPattern_local != ']') && (uVar9 != 0 && *zPattern_local != '\0')) break;
        }
        else {
          if (uVar4 == 0x5d) {
            if (bVar8 == bVar15) {
              return 1;
            }
            goto LAB_00127cae;
          }
          if (uVar4 == 0) {
            return 1;
          }
        }
        uVar9 = uVar4;
        if (uVar10 == uVar4) {
          bVar8 = true;
        }
        goto LAB_00127df7;
      }
      uVar10 = sqlite3Utf8Read(&zPattern_local);
      if (uVar10 == 0) {
        return 1;
      }
      local_38 = zPattern_local;
    }
    uVar5 = (uint)(char)*local_58;
    if ((char)*local_58 < '\0') {
      uVar5 = sqlite3Utf8Read(&local_58);
    }
    else {
      local_58 = local_58 + 1;
    }
    if ((uVar10 != uVar5) &&
       (((uVar2 == '\0' || (0x7f < (uVar5 | uVar10))) || (""[uVar10 & 0xff] != ""[uVar5 & 0xff]))))
    {
      if (uVar10 != local_40) {
        return 1;
      }
      if (uVar5 == 0) {
        return 1;
      }
      if (zPattern_local == local_38) {
        return 1;
      }
    }
  } while( true );
  uVar4 = sqlite3Utf8Read(&zPattern_local);
  bVar3 = true;
  if (uVar4 < uVar10) {
    bVar3 = bVar8;
  }
  if (uVar9 <= uVar10) {
    bVar8 = bVar3;
  }
  goto LAB_00127df5;
LAB_00127e88:
  uVar11 = (uint)(char)*zPattern_local;
  if ((int)uVar11 < 0) {
    uVar11 = sqlite3Utf8Read(&zPattern_local);
  }
  else {
    zPattern_local = zPattern_local + 1;
  }
  if ((uVar11 == bVar1) || ((char)uVar5 != '\0' && uVar11 == uVar5)) {
    if ((uVar11 != uVar5) || (uVar10 = sqlite3Utf8Read(&local_58), uVar10 != 0)) goto LAB_00127e88;
  }
  else {
    if (uVar11 == 0) {
      return 0;
    }
    if (uVar11 == local_4c) {
      if (local_48->matchSet != '\0') {
        puVar13 = zPattern_local + -1;
        pbVar14 = local_58;
        while( true ) {
          zString_00 = pbVar14;
          bVar1 = *zString_00;
          if (bVar1 == 0) {
            return 2;
          }
          iVar6 = patternCompare(puVar13,zString_00,local_48,local_4c);
          if (iVar6 != 1) break;
          pbVar14 = zString_00 + 1;
          if (0xbf < bVar1) {
            pbVar14 = zString_00 + 1;
          }
        }
        return iVar6;
      }
      uVar11 = sqlite3Utf8Read(&zPattern_local);
      if (uVar11 == 0) {
        return 2;
      }
    }
    puVar13 = zPattern_local;
    uVar12 = (ulong)uVar11;
    if (uVar11 < 0x80) {
      if (uVar2 == '\0') {
        local_3a = '\0';
      }
      else {
        local_3a = ""[uVar12];
        local_39 = 0;
        uVar12 = (ulong)(byte)((byte)uVar11 & (~""[uVar12] | 0xdf));
      }
      local_3b = (char)uVar12;
      pbVar14 = local_58;
      while (sVar7 = strcspn((char *)pbVar14,&local_3b), pbVar14[sVar7] != 0) {
        pbVar14 = pbVar14 + sVar7 + 1;
        iVar6 = patternCompare(puVar13,pbVar14,local_48,local_4c);
        if (iVar6 != 1) {
          return iVar6;
        }
      }
    }
    else {
      while( true ) {
        uVar5 = (uint)(char)*local_58;
        if ((char)*local_58 < '\0') {
          uVar5 = sqlite3Utf8Read(&local_58);
        }
        else {
          local_58 = local_58 + 1;
        }
        if (uVar5 == 0) break;
        if ((uVar5 == uVar11) &&
           (iVar6 = patternCompare(puVar13,local_58,local_48,local_4c), iVar6 != 1)) {
          return iVar6;
        }
      }
    }
  }
  return 2;
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 matchOther                   /* The escape char (LIKE) or '[' (GLOB) */
){
  u32 c, c2;                       /* Next pattern and input string chars */
  u32 matchOne = pInfo->matchOne;  /* "?" or "_" */
  u32 matchAll = pInfo->matchAll;  /* "*" or "%" */
  u8 noCase = pInfo->noCase;       /* True if uppercase==lowercase */
  const u8 *zEscaped = 0;          /* One past the last escaped input char */

  while( (c = Utf8Read(zPattern))!=0 ){
    if( c==matchAll ){  /* Match "*" */
      /* Skip over multiple "*" characters in the pattern.  If there
      ** are also "?" characters, skip those as well, but consume a
      ** single character of the input string for each "?" skipped */
      while( (c=Utf8Read(zPattern)) == matchAll
             || (c == matchOne && matchOne!=0) ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return SQLITE_NOWILDCARDMATCH;
        }
      }
      if( c==0 ){
        return SQLITE_MATCH;   /* "*" at the end of the pattern matches */
      }else if( c==matchOther ){
        if( pInfo->matchSet==0 ){
          c = sqlite3Utf8Read(&zPattern);
          if( c==0 ) return SQLITE_NOWILDCARDMATCH;
        }else{
          /* "[...]" immediately follows the "*".  We have to do a slow
          ** recursive search in this case, but it is an unusual case. */
          assert( matchOther<0x80 );  /* '[' is a single-byte character */
          while( *zString ){
            int bMatch = patternCompare(&zPattern[-1],zString,pInfo,matchOther);
            if( bMatch!=SQLITE_NOMATCH ) return bMatch;
            SQLITE_SKIP_UTF8(zString);
          }
          return SQLITE_NOWILDCARDMATCH;
        }
      }

      /* At this point variable c contains the first character of the
      ** pattern string past the "*".  Search in the input string for the
      ** first matching character and recursively continue the match from
      ** that point.
      **
      ** For a case-insensitive search, set variable cx to be the same as
      ** c but in the other case and search the input string for either
      ** c or cx.
      */
      if( c<0x80 ){
        char zStop[3];
        int bMatch;
        if( noCase ){
          zStop[0] = sqlite3Toupper(c);
          zStop[1] = sqlite3Tolower(c);
          zStop[2] = 0;
        }else{
          zStop[0] = c;
          zStop[1] = 0;
        }
        while(1){
          zString += strcspn((const char*)zString, zStop);
          if( zString[0]==0 ) break;
          zString++;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }else{
        int bMatch;
        while( (c2 = Utf8Read(zString))!=0 ){
          if( c2!=c ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }
      return SQLITE_NOWILDCARDMATCH;
    }
    if( c==matchOther ){
      if( pInfo->matchSet==0 ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ) return SQLITE_NOMATCH;
        zEscaped = zPattern;
      }else{
        u32 prior_c = 0;
        int seen = 0;
        int invert = 0;
        c = sqlite3Utf8Read(&zString);
        if( c==0 ) return SQLITE_NOMATCH;
        c2 = sqlite3Utf8Read(&zPattern);
        if( c2=='^' ){
          invert = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==']' ){
          if( c==']' ) seen = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        while( c2 && c2!=']' ){
          if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
            c2 = sqlite3Utf8Read(&zPattern);
            if( c>=prior_c && c<=c2 ) seen = 1;
            prior_c = 0;
          }else{
            if( c==c2 ){
              seen = 1;
            }
            prior_c = c2;
          }
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==0 || (seen ^ invert)==0 ){
          return SQLITE_NOMATCH;
        }
        continue;
      }
    }
    c2 = Utf8Read(zString);
    if( c==c2 ) continue;
    if( noCase  && sqlite3Tolower(c)==sqlite3Tolower(c2) && c<0x80 && c2<0x80 ){
      continue;
    }
    if( c==matchOne && zPattern!=zEscaped && c2!=0 ) continue;
    return SQLITE_NOMATCH;
  }
  return *zString==0 ? SQLITE_MATCH : SQLITE_NOMATCH;
}